

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void begin_burn(level *lev,obj *obj,boolean already_lit)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  xchar local_2b;
  xchar local_2a;
  char local_29;
  xchar y;
  xchar x;
  long lStack_28;
  boolean do_timer;
  long turns;
  int radius;
  boolean already_lit_local;
  obj *obj_local;
  level *lev_local;
  
  turns._0_4_ = 3;
  lStack_28 = 0;
  local_29 = '\x01';
  turns._7_1_ = already_lit;
  _radius = obj;
  obj_local = (obj *)lev;
  if (((obj->age == 0) && (obj->otyp != 0xe9)) && (bVar1 = artifact_light(obj), bVar1 == '\0')) {
    return;
  }
  iVar2 = (int)_radius->otyp;
  if (1 < iVar2 - 0xe5U) {
    if (iVar2 - 0xe7U < 2) {
      if (_radius->age < 0x97) {
        if (_radius->age < 0x65) {
          if (_radius->age < 0x33) {
            if (_radius->age < 0x1a) {
              lStack_28 = (long)_radius->age;
            }
            else {
              lStack_28 = (long)_radius->age + -0x19;
            }
          }
          else {
            lStack_28 = (long)_radius->age + -0x32;
          }
        }
        else {
          lStack_28 = (long)_radius->age + -100;
        }
      }
      else {
        lStack_28 = (long)_radius->age + -0x96;
      }
      goto LAB_002fdd19;
    }
    if (iVar2 == 0xe9) {
      *(uint *)&_radius->field_0x4a = *(uint *)&_radius->field_0x4a & 0xfff7ffff | 0x80000;
      local_29 = '\0';
      goto LAB_002fdd19;
    }
    if (iVar2 != 0x10b) {
      if (iVar2 == 0x142) {
        lStack_28 = (long)_radius->age;
        turns._0_4_ = 1;
      }
      else {
        bVar1 = artifact_light(_radius);
        if (bVar1 == '\0') {
          if ((((_radius->otyp < 0x5f) || (0x69 < _radius->otyp)) &&
              ((_radius->otyp < 0x54 || (0x5e < _radius->otyp)))) ||
             ((obj_descr[objects[_radius->otyp].oc_descr_idx].oc_descr == (char *)0x0 ||
              (iVar2 = strncmp(obj_descr[objects[_radius->otyp].oc_descr_idx].oc_descr,"gold ",5),
              iVar2 != 0)))) {
            pcVar3 = xname(_radius);
            warning("begin burn: unexpected %s",pcVar3);
            lStack_28 = (long)_radius->age;
          }
          else {
            *(uint *)&_radius->field_0x4a = *(uint *)&_radius->field_0x4a & 0xfff7ffff | 0x80000;
            local_29 = '\0';
          }
        }
        else {
          *(uint *)&_radius->field_0x4a = *(uint *)&_radius->field_0x4a & 0xfff7ffff | 0x80000;
          local_29 = '\0';
          turns._0_4_ = 2;
        }
      }
      goto LAB_002fdd19;
    }
  }
  if (_radius->age < 0x4c) {
    if (_radius->age < 0x10) {
      lStack_28 = (long)_radius->age;
    }
    else {
      lStack_28 = (long)_radius->age + -0xf;
    }
  }
  else {
    lStack_28 = (long)_radius->age + -0x4b;
  }
  turns._0_4_ = candle_light_range(_radius);
LAB_002fdd19:
  if (local_29 == '\0') {
    if ((_radius->where == '\x03') && (turns._7_1_ == '\0')) {
      update_inventory();
    }
  }
  else {
    bVar1 = start_timer(_radius->olev,lStack_28,2,3,_radius);
    if (bVar1 == '\0') {
      *(uint *)&_radius->field_0x4a = *(uint *)&_radius->field_0x4a & 0xfff7ffff;
    }
    else {
      *(uint *)&_radius->field_0x4a = *(uint *)&_radius->field_0x4a & 0xfff7ffff | 0x80000;
      _radius->age = _radius->age - (int)lStack_28;
      if ((_radius->where == '\x03') && (turns._7_1_ == '\0')) {
        update_inventory();
      }
    }
  }
  if (((*(uint *)&_radius->field_0x4a >> 0x13 & 1) != 0) && (turns._7_1_ == '\0')) {
    bVar1 = get_obj_location(_radius,&local_2a,&local_2b,3);
    if (bVar1 == '\0') {
      warning("begin_burn: can\'t get obj position");
    }
    else {
      new_light_source((level *)obj_local,local_2a,local_2b,(int)turns,0,_radius);
    }
  }
  return;
}

Assistant:

void begin_burn(struct level *lev, struct obj *obj, boolean already_lit)
{
	int radius = 3;
	long turns = 0;
	boolean do_timer = TRUE;

	if (obj->age == 0 && obj->otyp != MAGIC_LAMP && !artifact_light(obj))
	    return;

	switch (obj->otyp) {
	    case MAGIC_LAMP:
		obj->lamplit = 1;
		do_timer = FALSE;
		break;

	    case POT_OIL:
		turns = obj->age;
		radius = 1;	/* very dim light */
		break;

	    case BRASS_LANTERN:
	    case OIL_LAMP:
		/* magic times are 150, 100, 50, 25, and 0 */
		if (obj->age > 150L)
		    turns = obj->age - 150L;
		else if (obj->age > 100L)
		    turns = obj->age - 100L;
		else if (obj->age > 50L)
		    turns = obj->age - 50L;
		else if (obj->age > 25L)
		    turns = obj->age - 25L;
		else
		    turns = obj->age;
		break;

	    case CANDELABRUM_OF_INVOCATION:
	    case TALLOW_CANDLE:
	    case WAX_CANDLE:
		/* magic times are 75, 15, and 0 */
		if (obj->age > 75L)
		    turns = obj->age - 75L;
		else if (obj->age > 15L)
		    turns = obj->age - 15L;
		else
		    turns = obj->age;
		radius = candle_light_range(obj);
		break;

	    default:
                /* [ALI] Support artifact light sources */
                if (artifact_light(obj)) {
		    obj->lamplit = 1;
		    do_timer = FALSE;
		    radius = 2;
		} else if (Is_gold_dragon_armor(obj->otyp)) {
		    obj->lamplit = 1;
		    do_timer = FALSE;
		} else {
		    warning("begin burn: unexpected %s", xname(obj));
		    turns = obj->age;
		}
		break;
	}

	if (do_timer) {
	    if (start_timer(obj->olev, turns, TIMER_OBJECT,
					BURN_OBJECT, obj)) {
		obj->lamplit = 1;
		obj->age -= turns;
		if (carried(obj) && !already_lit)
		    update_inventory();
	    } else {
		obj->lamplit = 0;
	    }
	} else {
	    if (carried(obj) && !already_lit)
		update_inventory();
	}

	if (obj->lamplit && !already_lit) {
	    xchar x, y;

	    if (get_obj_location(obj, &x, &y, CONTAINED_TOO|BURIED_TOO))
		new_light_source(lev, x, y, radius, LS_OBJECT, obj);
	    else
		warning("begin_burn: can't get obj position");
	}
}